

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  Message MVar2;
  _Alloc_hider _Var3;
  int iVar4;
  size_t sVar5;
  CapturedStream **in_RDX;
  ostream *poVar6;
  uint uVar7;
  ostream *poVar8;
  char *pcVar9;
  bool bVar10;
  regmatch_t match;
  Message buffer;
  string error_message;
  string local_88;
  Message local_68;
  string local_60;
  string local_40;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream_abi_cxx11_(&local_40,(internal *)&g_captured_stderr,in_RDX);
  Message::Message(&local_68);
  poVar6 = (ostream *)((long)local_68.ss_.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Death test: ",0xc);
  pcVar9 = this->statement_;
  if (pcVar9 == (char *)0x0) {
    sVar5 = 6;
    pcVar9 = "(null)";
  }
  else {
    sVar5 = strlen(pcVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if (this->regex_[8] == (RE)0x1) {
        iVar4 = regexec((regex_t *)(this->regex_ + 0x50),local_40._M_dataplus._M_p,1,
                        (regmatch_t *)&local_88,0);
        bVar10 = iVar4 == 0;
      }
      else {
        bVar10 = false;
      }
      if (bVar10 == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"    Result: died but not with expected error.\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  Expected: ",0xc);
        pcVar9 = *(char **)this->regex_;
        if (pcVar9 == (char *)0x0) {
          sVar5 = 6;
          pcVar9 = "(null)";
        }
        else {
          sVar5 = strlen(pcVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual msg:\n",0xc);
        FormatDeathTestOutput(&local_88,&local_40);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_88._M_dataplus._M_p,local_88._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0016361d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"            ",0xc);
    uVar1 = this->status_;
    Message::Message((Message *)&local_60);
    uVar7 = uVar1 & 0x7f;
    if (uVar7 == 0) {
      poVar8 = (ostream *)(local_60._M_dataplus._M_p + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Exited with exit status ",0x18);
      std::ostream::operator<<((ostream *)poVar8,uVar1 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar7 * 0x1000000 + 0x1000000)) {
      poVar8 = (ostream *)(local_60._M_dataplus._M_p + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Terminated by signal ",0x15);
      std::ostream::operator<<((ostream *)poVar8,uVar7);
    }
    if ((char)uVar1 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_60._M_dataplus._M_p + 0x10)," (core dumped)",0xe);
    }
    _Var3._M_p = local_60._M_dataplus._M_p;
    StringStreamToString(&local_88,(stringstream *)local_60._M_dataplus._M_p);
    if ((stringstream *)_Var3._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)_Var3._M_p + 8))(_Var3._M_p);
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_60,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    break;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_88,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_88._M_dataplus._M_p,local_88._M_string_length);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_88,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_88._M_dataplus._M_p,local_88._M_string_length);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_88,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_88._M_dataplus._M_p,local_88._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_88,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       ,0x246);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_88);
    goto LAB_0016361b;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_0016361b:
  bVar10 = false;
LAB_0016361d:
  MVar2.ss_.ptr_ = local_68.ss_.ptr_;
  StringStreamToString(&local_88,(stringstream *)local_68.ss_.ptr_);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (MVar2.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)MVar2.ss_.ptr_ + 8))(MVar2.ss_.ptr_);
    local_68.ss_.ptr_ =
         (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}